

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void gz_compress(FILE *in,gzFile out)

{
  undefined1 *__ptr;
  int iVar1;
  uint uVar2;
  int iVar3;
  gzFile pgVar4;
  size_t sVar5;
  gzFile pgVar6;
  char *pcVar7;
  char *pcVar8;
  ulong unaff_RBP;
  FILE *pFVar9;
  char *pcVar10;
  char *pcVar11;
  FILE *pFVar12;
  FILE *__s;
  char *pcVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  int err;
  char buf [16384];
  undefined4 uStack_88f8;
  undefined1 uStack_88f4;
  char *pcStack_88e0;
  gzFile pgStack_88d8;
  ulong uStack_88d0;
  char *pcStack_88c8;
  char *pcStack_88c0;
  code *pcStack_88b8;
  char acStack_88b0 [1024];
  FILE *pFStack_84b0;
  gzFile pgStack_84a8;
  char acStack_8488 [1024];
  FILE *pFStack_8088;
  FILE *pFStack_8080;
  code *pcStack_8078;
  char acStack_8064 [4];
  char acStack_8060 [16392];
  gzFile pgStack_4058;
  FILE *pFStack_4050;
  undefined1 *puStack_4048;
  FILE local_402c [75];
  
  __ptr = &local_402c[0].field_0x4;
  do {
    pFVar9 = (FILE *)0x1;
    pgVar4 = (gzFile)fread(__ptr,1,0x4000,(FILE *)in);
    pFVar12 = (FILE *)in;
    iVar1 = ferror((FILE *)in);
    if (iVar1 != 0) {
      gz_compress_cold_1();
      goto LAB_001015d3;
    }
    if ((int)pgVar4 == 0) goto LAB_001015ab;
    iVar1 = gzwrite(out,__ptr,(ulong)pgVar4 & 0xffffffff);
  } while (iVar1 == (int)pgVar4);
  pFVar9 = local_402c;
  gz_compress_cold_2();
LAB_001015ab:
  fclose((FILE *)in);
  pFVar12 = (FILE *)out;
  iVar1 = gzclose();
  if (iVar1 == 0) {
    return;
  }
LAB_001015d3:
  gz_compress_cold_3();
  pgStack_4058 = out;
  pFStack_4050 = in;
  puStack_4048 = __ptr;
  do {
    pcStack_8078 = (code *)0x101600;
    pcVar10 = acStack_8060;
    uVar2 = gzread(pFVar12,acStack_8060,0x4000);
    if ((int)uVar2 < 0) {
      pcVar10 = acStack_8064;
      pcStack_8078 = (code *)0x101656;
      __s = pFVar12;
      gz_uncompress_cold_4();
      goto LAB_00101656;
    }
    if (uVar2 == 0) goto LAB_00101623;
    unaff_RBP = (ulong)uVar2;
    pcVar10 = (char *)0x1;
    pcStack_8078 = (code *)0x10161a;
    sVar5 = fwrite(acStack_8060,1,(ulong)uVar2,pFVar9);
  } while (uVar2 == (uint)sVar5);
  pcStack_8078 = (code *)0x101623;
  gz_uncompress_cold_1();
LAB_00101623:
  pcStack_8078 = (code *)0x10162b;
  __s = pFVar9;
  iVar1 = fclose(pFVar9);
  if (iVar1 == 0) {
    pcStack_8078 = (code *)0x101637;
    __s = pFVar12;
    iVar1 = gzclose();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
LAB_00101656:
    pcStack_8078 = (code *)0x10165b;
    gz_uncompress_cold_2();
  }
  pcStack_8078 = file_compress;
  gz_uncompress_cold_3();
  pcVar8 = acStack_8488;
  pcVar11 = pcVar10;
  pFStack_8088 = pFVar12;
  pFStack_8080 = pFVar9;
  pcStack_8078 = (code *)acStack_8060;
  sVar5 = strlen((char *)__s);
  if (sVar5 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_8488,0x400,"%s%s",__s,".gz");
    pcVar11 = "rb";
    pFVar9 = fopen64((char *)__s,"rb");
    if (pFVar9 == (FILE *)0x0) goto LAB_001016f1;
    pcVar11 = pcVar10;
    pgVar6 = (gzFile)gzopen64(acStack_8488);
    if (pgVar6 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar9,pgVar6);
      unlink((char *)__s);
      return;
    }
  }
  file_compress_cold_1();
  pcVar17 = acStack_88b0;
  pcStack_88b8 = (code *)0x101719;
  pFStack_84b0 = __s;
  pgStack_84a8 = pgVar4;
  pcVar7 = (char *)strlen(pcVar8);
  uVar15 = (ulong)pcVar7 & 0xffffffff;
  if (uVar15 < 0x3fd) {
    pgVar4 = (gzFile)0x400;
    pcStack_88b8 = (code *)0x10174e;
    snprintf(acStack_88b0,0x400,"%s",pcVar8);
    if ((uint)pcVar7 < 4) {
LAB_0010176c:
      pgVar4 = (gzFile)(0x400 - uVar15);
      pcStack_88b8 = (code *)0x10178b;
      snprintf(acStack_88b0 + uVar15,(size_t)pgVar4,"%s",".gz");
      pcVar10 = acStack_88b0;
      pcVar17 = pcVar8;
    }
    else {
      pcStack_88b8 = (code *)0x101768;
      iVar1 = strcmp(pcVar8 + (uVar15 - 3),".gz");
      if (iVar1 != 0) goto LAB_0010176c;
      acStack_88b0[(uint)pcVar7 - 3] = '\0';
      pcVar10 = pcVar8;
    }
    pcVar11 = "rb";
    pcStack_88b8 = (code *)0x10179d;
    pgVar6 = (gzFile)gzopen64(pcVar10);
    pcVar7 = pcVar17;
    if (pgVar6 == (gzFile)0x0) goto LAB_001017f3;
    pcVar11 = "wb";
    pcStack_88b8 = (code *)0x1017b4;
    pFVar9 = fopen64(pcVar17,"wb");
    if (pFVar9 != (FILE *)0x0) {
      pcStack_88b8 = (code *)0x1017c4;
      gz_uncompress(pgVar6,(FILE *)pFVar9);
      pcStack_88b8 = (code *)0x1017cc;
      unlink(pcVar10);
      return;
    }
  }
  else {
    pcStack_88b8 = (code *)0x1017f3;
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar6 = pgVar4;
    pcStack_88b8 = (code *)0x1017fb;
    file_uncompress_cold_2();
  }
  pcStack_88b8 = main;
  pcVar13 = pcVar8;
  file_uncompress_cold_1();
  uVar16 = (ulong)pcVar13 & 0xffffffff;
  uStack_88f4 = 0;
  uStack_88f8 = 0x20366277;
  pcVar17 = *(char **)pcVar11;
  prog = pcVar17;
  pcStack_88e0 = pcVar8;
  pgStack_88d8 = pgVar6;
  uStack_88d0 = uVar15;
  pcStack_88c8 = pcVar10;
  pcStack_88c0 = pcVar7;
  pcStack_88b8 = (code *)unaff_RBP;
  pcVar8 = strrchr(pcVar17,0x2f);
  pcVar10 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    pcVar10 = pcVar17;
  }
  iVar1 = strcmp(pcVar10,"gunzip");
  if (iVar1 == 0) {
    bVar18 = true;
    bVar14 = false;
  }
  else {
    iVar1 = strcmp(pcVar10,"zcat");
    bVar18 = iVar1 == 0;
    bVar14 = bVar18;
  }
  pcVar11 = pcVar11 + 8;
  iVar1 = (int)pcVar13 + -1;
  if (1 < (int)pcVar13) {
    do {
      pcVar10 = *(char **)pcVar11;
      iVar3 = strcmp(pcVar10,"-c");
      if (iVar3 == 0) {
        bVar14 = true;
      }
      else {
        iVar3 = strcmp(pcVar10,"-d");
        if (iVar3 == 0) {
          bVar18 = true;
        }
        else {
          iVar3 = strcmp(pcVar10,"-f");
          if (iVar3 == 0) {
            uStack_88f8 = CONCAT13(0x66,(undefined3)uStack_88f8);
          }
          else {
            iVar3 = strcmp(pcVar10,"-h");
            if (iVar3 == 0) {
              uStack_88f8 = CONCAT13(0x68,(undefined3)uStack_88f8);
            }
            else {
              iVar3 = strcmp(pcVar10,"-r");
              if (iVar3 == 0) {
                uStack_88f8 = CONCAT13(0x52,(undefined3)uStack_88f8);
              }
              else {
                if (*pcVar10 != '-') {
                  iVar1 = (int)uVar16 + -1;
                  goto LAB_0010195d;
                }
                if ((8 < (byte)(pcVar10[1] - 0x31U)) || (pcVar10[2] != '\0')) goto LAB_0010195d;
                uStack_88f8._0_3_ = CONCAT12(pcVar10[1],(undefined2)uStack_88f8);
              }
            }
          }
        }
      }
      pcVar11 = pcVar11 + 8;
      iVar1 = iVar1 + -1;
      uVar2 = (int)uVar16 - 1;
      uVar16 = (ulong)uVar2;
    } while (1 < (int)uVar2);
    iVar1 = 0;
  }
LAB_0010195d:
  if (uStack_88f8._3_1_ == ' ') {
    uStack_88f8 = uStack_88f8 & 0xffffff;
  }
  if (iVar1 == 0) {
    if (bVar18) {
      iVar1 = fileno(_stdin);
      pgVar4 = (gzFile)gzdopen(iVar1,"rb");
      if (pgVar4 == (gzFile)0x0) {
LAB_00101abc:
        main_cold_3();
LAB_00101ac1:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar4,(FILE *)_stdout);
    }
    else {
      iVar1 = fileno(_stdout);
      pgVar4 = (gzFile)gzdopen(iVar1,&uStack_88f8);
      if (pgVar4 == (gzFile)0x0) goto LAB_00101ac1;
      gz_compress((FILE *)_stdin,pgVar4);
    }
  }
  else {
    do {
      pcVar10 = *(char **)pcVar11;
      if (bVar18) {
        if (bVar14) {
          pgVar4 = (gzFile)gzopen64(pcVar10,"rb");
          if (pgVar4 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar4,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar10);
        }
      }
      else if (bVar14) {
        pFVar9 = fopen64(pcVar10,"rb");
        if (pFVar9 == (FILE *)0x0) {
          perror(*(char **)pcVar11);
        }
        else {
          iVar3 = fileno(_stdout);
          pgVar4 = (gzFile)gzdopen(iVar3,&uStack_88f8);
          if (pgVar4 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101abc;
          }
          gz_compress((FILE *)pFVar9,pgVar4);
        }
      }
      else {
        file_compress(pcVar10,(char *)&uStack_88f8);
      }
      pcVar11 = pcVar11 + 8;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void gz_compress(in, out)
    FILE   *in;
    gzFile out;
{
    local char buf[BUFLEN];
    int len;
    int err;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    for (;;) {
        len = (int)fread(buf, 1, sizeof(buf), in);
        if (ferror(in)) {
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (gzwrite(out, buf, (unsigned)len) != len) error(gzerror(out, &err));
    }
    fclose(in);
    if (gzclose(out) != Z_OK) error("failed gzclose");
}